

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::doFastFormatInt32
          (DecimalFormat *this,int32_t input,bool isNegative,UnicodeString *output)

{
  char cVar1;
  bool bVar2;
  ConstChar16Ptr local_68;
  int32_t local_60;
  int iStack_5c;
  int32_t len;
  div_t res;
  int8_t i;
  int8_t group;
  char16_t *ptr;
  char16_t localBuffer [13];
  UnicodeString *output_local;
  bool isNegative_local;
  int32_t input_local;
  DecimalFormat *this_local;
  
  output_local._4_4_ = input;
  if (isNegative) {
    UnicodeString::append(output,(this->fields->fastData).cpMinusSign);
    output_local._4_4_ = -input;
  }
  res.quot._3_1_ = '\0';
  res.quot._2_1_ = '\0';
  unique0x100001d5 = localBuffer + 9;
  while( true ) {
    bVar2 = false;
    if ((res.quot._2_1_ < (this->fields->fastData).maxInt) &&
       (bVar2 = true, output_local._4_4_ == 0)) {
      bVar2 = res.quot._2_1_ < (this->fields->fastData).minInt;
    }
    if (!bVar2) break;
    cVar1 = res.quot._3_1_ + '\x01';
    bVar2 = res.quot._3_1_ == '\x03';
    res.quot._3_1_ = cVar1;
    if ((bVar2) && ((this->fields->fastData).cpGroupingSeparator != L'\0')) {
      stack0xffffffffffffffb0[-1] = (this->fields->fastData).cpGroupingSeparator;
      res.quot._3_1_ = '\x01';
      unique0x100001cd = stack0xffffffffffffffb0 + -1;
    }
    _iStack_5c = div(output_local._4_4_,10);
    stack0xffffffffffffffb0[-1] = (this->fields->fastData).cpZero + iStack_5c._4_2_;
    output_local._4_4_ = iStack_5c;
    res.quot._2_1_ = res.quot._2_1_ + '\x01';
    unique0x100001dd = stack0xffffffffffffffb0 + -1;
  }
  local_60 = 0xd - (int)((ulong)((long)stack0xffffffffffffffb0 - (long)&ptr) >> 1);
  ConstChar16Ptr::ConstChar16Ptr(&local_68,stack0xffffffffffffffb0);
  UnicodeString::append(output,&local_68,local_60);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  return;
}

Assistant:

void DecimalFormat::doFastFormatInt32(int32_t input, bool isNegative, UnicodeString& output) const {
    U_ASSERT(fields->canUseFastFormat);
    if (isNegative) {
        output.append(fields->fastData.cpMinusSign);
        U_ASSERT(input != INT32_MIN);  // handled by callers
        input = -input;
    }
    // Cap at int32_t to make the buffer small and operations fast.
    // Longest string: "2,147,483,648" (13 chars in length)
    static constexpr int32_t localCapacity = 13;
    char16_t localBuffer[localCapacity];
    char16_t* ptr = localBuffer + localCapacity;
    int8_t group = 0;
    for (int8_t i = 0; i < fields->fastData.maxInt && (input != 0 || i < fields->fastData.minInt); i++) {
        if (group++ == 3 && fields->fastData.cpGroupingSeparator != 0) {
            *(--ptr) = fields->fastData.cpGroupingSeparator;
            group = 1;
        }
        std::div_t res = std::div(input, 10);
        *(--ptr) = static_cast<char16_t>(fields->fastData.cpZero + res.rem);
        input = res.quot;
    }
    int32_t len = localCapacity - static_cast<int32_t>(ptr - localBuffer);
    output.append(ptr, len);
}